

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

bool __thiscall adios2::IO::RemoveAttribute(IO *this,string *name)

{
  IO *pointer;
  bool bVar1;
  allocator local_41;
  string local_40;
  
  pointer = this->m_IO;
  std::__cxx11::string::string((string *)&local_40,"in call to IO::RemoveAttribute",&local_41);
  helper::CheckForNullptr<adios2::core::IO>(pointer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = (bool)adios2::core::IO::RemoveAttribute((string *)this->m_IO);
  return bVar1;
}

Assistant:

bool IO::RemoveAttribute(const std::string &name)
{
    helper::CheckForNullptr(m_IO, "in call to IO::RemoveAttribute");
    return m_IO->RemoveAttribute(name);
}